

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
(anonymous_namespace)::isCodeBlockLine_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,CTokenGroupIter *i,
          CTokenGroupIter end)

{
  char *pcVar1;
  CTokenGroupIter *pCVar2;
  ulong uVar3;
  pointer pcVar4;
  int iVar5;
  type pTVar6;
  reference_type __rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  long lVar8;
  CTokenGroupIter end_00;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> r;
  undefined1 local_68 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pTVar6 = boost::shared_ptr<markdown::Token>::operator->
                     ((shared_ptr<markdown::Token> *)(*(long *)this + 0x10));
  end_00._M_node = (_List_node_base *)pTVar6->_vptr_Token;
  iVar5 = (*(code *)end_00._M_node[4]._M_prev)(pTVar6);
  if ((char)iVar5 == '\0') {
    pTVar6 = boost::shared_ptr<markdown::Token>::operator->
                       ((shared_ptr<markdown::Token> *)(*(long *)this + 0x10));
    (*pTVar6->_vptr_Token[7])(local_68,pTVar6);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pTVar6 = boost::shared_ptr<markdown::Token>::operator->
                         ((shared_ptr<markdown::Token> *)(*(long *)this + 0x10));
      iVar5 = (*pTVar6->_vptr_Token[8])(pTVar6);
      if ((char)iVar5 != '\0') {
        pTVar6 = boost::shared_ptr<markdown::Token>::operator->
                           ((shared_ptr<markdown::Token> *)(*(long *)this + 0x10));
        (*pTVar6->_vptr_Token[7])(local_68,pTVar6);
        pbVar7 = boost::
                 optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 ::operator*((optional<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                              *)local_68);
        uVar3 = pbVar7->_M_string_length;
        if (3 < uVar3) {
          pcVar4 = (pbVar7->_M_dataplus)._M_p;
          lVar8 = 0;
          do {
            if (lVar8 == 4) {
              *(undefined8 *)this = **(undefined8 **)this;
              local_68._0_8_ = local_68 + 0x10;
              std::__cxx11::string::
              _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        ((string *)local_68,pcVar4 + 4,pcVar4 + uVar3);
              boost::optional_detail::
              optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::optional_base(&__return_storage_ptr__->super_type,local_68);
              std::__cxx11::string::~string((string *)local_68);
              return __return_storage_ptr__;
            }
            pcVar1 = pcVar4 + lVar8;
            lVar8 = lVar8 + 1;
          } while (*pcVar1 == ' ');
        }
      }
    }
  }
  else {
    pCVar2 = (CTokenGroupIter *)**(long **)this;
    *(CTokenGroupIter **)this = pCVar2;
    if (pCVar2 != i) {
      isCodeBlockLine_abi_cxx11_
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_68,this,i,end_00);
      if (local_68[0] == (string)0x1) {
        __rhs = boost::
                optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::get((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_68);
        std::operator+(&local_40,"\n",__rhs);
        boost::optional_detail::
        optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::optional_base(&__return_storage_ptr__->super_type,&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        boost::optional_detail::
        optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~optional_base((optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_68);
        return __return_storage_ptr__;
      }
      boost::optional_detail::
      optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~optional_base((optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_68);
    }
    *(undefined8 *)this = *(undefined8 *)(*(long *)this + 8);
  }
  (__return_storage_ptr__->super_type).m_initialized = false;
  return __return_storage_ptr__;
}

Assistant:

optional<std::string> isCodeBlockLine(CTokenGroupIter& i, CTokenGroupIter end) {
	if ((*i)->isBlankLine()) {
		// If we get here, we're already in a code block.
		++i;
		if (i!=end) {
			optional<std::string> r=isCodeBlockLine(i, end);
			if (r) return std::string("\n"+*r);
		}
		--i;
	} else if ((*i)->text() && (*i)->canContainMarkup()) {
		const std::string& line(*(*i)->text());
		if (line.length()>=4) {
			std::string::const_iterator si=line.begin(), sie=si+4;
			while (si!=sie && *si==' ') ++si;
			if (si==sie) {
				++i;
				return std::string(si, line.end());
			}
		}
	}
	return none;
}